

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_summaries,CaptureSummary **cs)

{
  uint uVar1;
  CaptureLine *x;
  pointer pp_Var2;
  _capture_line *__s1;
  value_type __dest;
  uint64_t uVar3;
  bool bVar4;
  int iVar5;
  size_t i;
  char *__s2;
  char *__s2_00;
  char *__s2_01;
  char *__s;
  char *__s_00;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t i_7;
  long lVar11;
  size_t i_1;
  size_type __n;
  bool bVar12;
  size_t j;
  size_t i_2;
  pointer pp_Var13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> frequent_tld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_2ld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_tld;
  ulong local_440;
  uint64_t local_438;
  value_type local_420;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> complete;
  CaptureLine *tld_line;
  int local_398;
  anon_union_128_2_8b70880b_for__capture_line_2 local_394;
  uint64_t local_310;
  CaptureLine current_line;
  uint64_t skipped_tld_length [64];
  
  complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_420 = (value_type)operator_new(0xd0);
  memset(skipped_tld_length,0,0x200);
  __s2 = DnsStats::GetTableName(0x1d);
  __s2_00 = DnsStats::GetTableName(0x38);
  __s2_01 = DnsStats::GetTableName(0x26);
  __s = DnsStats::GetTableName(0x28);
  __s_00 = DnsStats::GetTableName(0x1c);
  pcVar6 = DnsStats::GetTableName(0x3a);
  pcVar7 = DnsStats::GetTableName(0x39);
  bVar15 = __s2 != (char *)0x0;
  bVar16 = __s2_01 != (char *)0x0;
  bVar17 = __s != (char *)0x0;
  bVar18 = __s_00 != (char *)0x0;
  bVar19 = local_420 != (value_type)0x0;
  bVar20 = pcVar6 != (char *)0x0;
  bVar21 = pcVar7 != (char *)0x0;
  bVar12 = bVar21 && ((bVar20 && ((bVar18 && bVar17) && (bVar16 && bVar15))) && bVar19);
  __n = 0;
  local_440 = 0;
  for (uVar8 = 0;
      (bVar21 && ((bVar20 && ((bVar18 && bVar17) && (bVar16 && bVar15))) && bVar19)) &&
      uVar8 < nb_summaries; uVar8 = uVar8 + 1) {
    uVar10 = (long)(cs[uVar8]->summary).
                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(cs[uVar8]->summary).
                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (local_440 < uVar10) {
      local_440 = uVar10;
    }
    __n = __n + uVar10;
  }
  if (bVar21 && ((bVar20 && ((bVar18 && bVar17) && (bVar16 && bVar15))) && bVar19)) {
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve(&complete,__n);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              (&leaked_tld,nb_summaries * 0x30);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              (&leaked_2ld,nb_summaries * 0x30);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              (&frequent_tld,nb_summaries << 4);
  }
  local_438 = 0;
  uVar8 = 0;
  do {
    __dest = local_420;
    if (nb_summaries <= uVar8 ||
        (!bVar21 || ((!bVar20 || ((!bVar18 || !bVar17) || (!bVar16 || !bVar15))) || !bVar19))) {
      if (bVar12 && local_438 != 0) {
        local_420->count = local_438;
        *(undefined8 *)&local_420->key_type = 0;
        sVar9 = strlen(__s);
        memcpy(__dest,__s,sVar9 + 1);
        std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                  (&complete,&local_420);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                  )complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)0x1904b2);
      std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
                (&this->summary,local_440 + nb_summaries * 0x40);
      if (bVar12) {
        uVar8 = 0;
        while (pp_Var13 = complete.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
              uVar10 = (long)complete.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)complete.
                             super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3, uVar8 < uVar10) {
          memcpy(&current_line,
                 complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8],0xd0);
          uVar14 = uVar8;
          while (uVar3 = current_line.count, uVar14 = uVar14 + 1, uVar8 = uVar10, uVar14 < uVar10) {
            x = pp_Var13[uVar14];
            bVar15 = CaptureLineIsSameKey(x,&current_line);
            uVar8 = uVar14;
            if (!bVar15) break;
            current_line.count = uVar3 + x->count;
          }
          iVar5 = strcmp(current_line.registry_name,__s2);
          if (iVar5 == 0) {
            tld_line = (CaptureLine *)operator_new(0xd0);
            memcpy(tld_line,&current_line,0xd0);
            std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                      (&leaked_tld,&tld_line);
          }
          else {
            iVar5 = strcmp(current_line.registry_name,__s2_00);
            if (iVar5 == 0) {
              tld_line = (CaptureLine *)operator_new(0xd0);
              memcpy(tld_line,&current_line,0xd0);
              std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                        (&leaked_2ld,&tld_line);
            }
            else {
              iVar5 = strcmp(current_line.registry_name,__s2_01);
              if (iVar5 == 0) {
                tld_line = (CaptureLine *)operator_new(0xd0);
                memcpy(tld_line,&current_line,0xd0);
                std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                          (&frequent_tld,&tld_line);
              }
              else {
                AddLine(this,&current_line,true);
              }
            }
          }
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                  ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                    )frequent_tld.
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                    )frequent_tld.
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)0x190534);
        for (uVar8 = 0;
            (uVar8 < 0x100 &&
            (uVar8 < (ulong)((long)frequent_tld.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)frequent_tld.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)));
            uVar8 = uVar8 + 1) {
          AddLine(this,frequent_tld.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar8],true);
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                  ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                    )leaked_2ld.
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                    )leaked_2ld.
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)0x190534);
        for (uVar8 = 0;
            (uVar8 < 0x100 &&
            (uVar8 < (ulong)((long)leaked_2ld.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)leaked_2ld.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)));
            uVar8 = uVar8 + 1) {
          AddLine(this,leaked_2ld.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar8],true);
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
                  ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                    )leaked_tld.
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                    )leaked_tld.
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)0x190534);
        for (uVar8 = 0;
            (uVar8 < 0x100 &&
            (uVar8 < (ulong)((long)leaked_tld.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)leaked_tld.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)));
            uVar8 = uVar8 + 1) {
          AddLine(this,leaked_tld.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start[uVar8],true);
        }
        pp_Var13 = (this->summary).
                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pp_Var2 = (this->summary).
                  super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (lVar11 = 0; (long)pp_Var2 - (long)pp_Var13 >> 3 != lVar11; lVar11 = lVar11 + 1) {
          __s1 = pp_Var13[lVar11];
          iVar5 = strcmp(__s1->registry_name,__s_00);
          if ((iVar5 == 0) && (uVar1 = (__s1->field_2).key_number, uVar1 - 1 < 0x3f)) {
            __s1->count = __s1->count + skipped_tld_length[uVar1];
            skipped_tld_length[uVar1] = 0;
          }
        }
        for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
          if (skipped_tld_length[lVar11] != 0) {
            local_398 = 0;
            local_394.key_number = (int)lVar11;
            local_310 = skipped_tld_length[lVar11];
            sVar9 = strlen(__s_00);
            memcpy((CaptureLine *)&tld_line,__s_00,sVar9 + 1);
            AddLine(this,(CaptureLine *)&tld_line,true);
            skipped_tld_length[lVar11] = 0;
          }
        }
        Sort(this);
      }
      for (uVar8 = 0;
          uVar8 < (ulong)((long)frequent_tld.
                                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)frequent_tld.
                                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1)
      {
        if (frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8] != (_capture_line *)0x0) {
          operator_delete(frequent_tld.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8]);
          frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
          .super__Vector_impl_data._M_start[uVar8] = (_capture_line *)0x0;
        }
      }
      for (uVar8 = 0;
          uVar8 < (ulong)((long)leaked_tld.
                                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)leaked_tld.
                                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1)
      {
        if (leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
            .super__Vector_impl_data._M_start[uVar8] != (_capture_line *)0x0) {
          operator_delete(leaked_tld.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8]);
          leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = (_capture_line *)0x0;
        }
      }
      for (uVar8 = 0;
          uVar8 < (ulong)((long)leaked_2ld.
                                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)leaked_2ld.
                                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1)
      {
        if (leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
            .super__Vector_impl_data._M_start[uVar8] != (_capture_line *)0x0) {
          operator_delete(leaked_2ld.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8]);
          leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] = (_capture_line *)0x0;
        }
      }
      if (local_420 != (value_type)0x0) {
        operator_delete(local_420);
      }
      std::_Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>::~_Vector_base
                (&frequent_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                );
      std::_Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>::~_Vector_base
                (&leaked_2ld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>);
      std::_Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>::~_Vector_base
                (&leaked_tld.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>);
      std::_Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>::~_Vector_base
                (&complete.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>);
      return bVar12;
    }
    lVar11 = 0;
    for (uVar10 = 0;
        pp_Var13 = (cs[uVar8]->summary).
                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(cs[uVar8]->summary).
                               super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var13 >> 3);
        uVar10 = uVar10 + 1) {
      pcVar6 = *(char **)((long)pp_Var13 + lVar11);
      iVar5 = strcmp(pcVar6,__s2_01);
      if (iVar5 == 0) {
        sVar9 = strlen(pcVar6 + 0x44);
        bVar4 = DnsStats::IsFrequentLeakTld((uint8_t *)(pcVar6 + 0x44),sVar9);
        pp_Var13 = (pointer)((long)(cs[uVar8]->summary).
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar11);
        if (bVar4) goto LAB_00190c80;
        local_438 = local_438 + (*pp_Var13)->count;
      }
      else {
        pp_Var13 = pp_Var13 + uVar10;
        iVar5 = strcmp(pcVar6,__s2);
        if ((iVar5 == 0) && (*(ulong *)(pcVar6 + 200) < 5)) {
          sVar9 = strlen(pcVar6 + 0x44);
          if (sVar9 < 0x40) {
            skipped_tld_length[sVar9] = skipped_tld_length[sVar9] + 1;
          }
        }
        else {
LAB_00190c80:
          std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
                    (&complete,pp_Var13);
        }
      }
      lVar11 = lVar11 + 8;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool CaptureSummary::Merge(size_t nb_summaries, CaptureSummary ** cs)
{
    bool ret = true;
    size_t max_size = 0;
    size_t complete_size = 0;
    std::vector<CaptureLine *> complete;
    std::vector<CaptureLine *> leaked_tld;
    std::vector<CaptureLine*> leaked_2ld;
    std::vector<CaptureLine *> frequent_tld;
    char const * leak_tld_id = NULL;
    char const * leak_2ld_id = NULL;
    char const * frequent_tld_id = NULL;
    char const * local_tld_id = NULL;
    char const * leak_by_length_id = NULL;
    char const* name_list_id = NULL;
    char const* addr_list_id = NULL;
    CaptureLine current_line;
    uint64_t nb_locally_leaked_tld = 0;
    CaptureLine *local_leak = new CaptureLine;
    uint64_t skipped_tld_length[64];

    memset(skipped_tld_length, 0, sizeof(skipped_tld_length));

    if (ret)
    {
        leak_tld_id = DnsStats::GetTableName(REGISTRY_DNS_LeakedTLD);
        leak_2ld_id = DnsStats::GetTableName(REGISTRY_DNS_LEAK_2NDLEVEL);
        frequent_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Frequent_TLD_Usage);
        local_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Local_TLD_Usage_Count);
        leak_by_length_id = DnsStats::GetTableName(REGISTRY_DNS_LeakByLength);
        name_list_id = DnsStats::GetTableName(REGISTRY_DNS_ERRONEOUS_NAME_LIST);
        addr_list_id = DnsStats::GetTableName(REGISTRY_DNS_ADDRESS_LIST);

        ret = (leak_tld_id != NULL && frequent_tld_id != NULL && local_tld_id != NULL && leak_by_length_id != NULL && local_leak != NULL
            && name_list_id != NULL && addr_list_id != NULL);
    }

    /* Compute the plausible max size and the complete size */
    for (size_t i = 0; ret && i < nb_summaries; i++)
    {
        if (cs[i]->Size() > max_size)
        {
            max_size = cs[i]->Size();
        }

        complete_size += cs[i]->Size();
    }

    /* Create a complete list that contains all the summaries */
    if (ret)
    {
        complete.reserve(complete_size);
        leaked_tld.reserve(48 * nb_summaries);
        leaked_2ld.reserve(48 * nb_summaries);
        frequent_tld.reserve(16 * nb_summaries);
    }

    for (size_t i = 0; ret && i < nb_summaries; i++) {
        for (size_t j = 0; j < cs[i]->Size(); j++) {
            if (strcmp(cs[i]->summary[j]->registry_name, frequent_tld_id) == 0)
            {
                /* This is a TLD "frequently used" by a client. We will only consider it in the summary
                 * if it is part of the TLD frequently leaked to the root.
                 */  
                if (DnsStats::IsFrequentLeakTld((uint8_t *)cs[i]->summary[j]->key_value,
                    strlen(cs[i]->summary[j]->key_value))) {
                    complete.push_back(cs[i]->summary[j]);
                }
                else
                {
                    nb_locally_leaked_tld += cs[i]->summary[j]->count;
                }
            }
            else if (strcmp(cs[i]->summary[j]->registry_name, leak_tld_id) == 0)
            {
                /* This is a TLD "frequently leaked" to the root */
                if (cs[i]->summary[j]->count <= 4)
                {
                    size_t len = strlen(cs[i]->summary[j]->key_value);

                    if (len < 64)
                    {
                        skipped_tld_length[len]++;
                    }
                }
                else
                {
                    complete.push_back(cs[i]->summary[j]);
                }
            }
            /* TODO: if local leak present, add to total */
            else
            {
                complete.push_back(cs[i]->summary[j]);
            }
        }
    }

    if (ret && nb_locally_leaked_tld != 0)
    {
        local_leak->count = nb_locally_leaked_tld;
        local_leak->key_type = 0;
        local_leak->key_number = 0; 
        
        memcpy(local_leak->registry_name, local_tld_id, strlen(local_tld_id) + 1);

        complete.push_back(local_leak);
    }

    /* Sort the complete list */
    std::sort(complete.begin(), complete.end(), CaptureLineIsLower);

    /* Now go through the list and perform the summations.
     * Put the frequent tld, 2nd ld and tls usage in separate lists */
    Reserve(max_size + 64* nb_summaries);

    for (size_t i = 0; ret && i < complete.size();) {
        /* Read the next capture line */
        current_line = *complete[i++];

        /* Summarize all matching lines */
        while (i < complete.size() && CaptureLineIsSameKey(complete[i], &current_line)) {
            current_line.count += complete[i]->count;
            i++;
        }

        /* Add line to summary, or to one of the special registries */

        if (strcmp(current_line.registry_name, leak_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                leaked_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, leak_2ld_id) == 0) {
            CaptureLine* second_ld_line = new CaptureLine;

            if (second_ld_line != NULL)
            {
                memcpy(second_ld_line, &current_line, sizeof(CaptureLine));
                leaked_2ld.push_back(second_ld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, frequent_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                frequent_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else {
            AddLine(&current_line, true);
        }
    }

    /* Sort and tabulate the most used TLD. */
    if (ret) {
        std::sort(frequent_tld.begin(), frequent_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < frequent_tld.size() && i < 256; i++) {
            AddLine(frequent_tld[i], true);
        }
    }

    /* Sort and tabulate the most used 2LD. */
    if (ret) {
        std::sort(leaked_2ld.begin(), leaked_2ld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_2ld.size() && i < 256; i++) {
            AddLine(leaked_2ld[i], true);
        }
    }

    /* Sort and tabulate the most leaked TLD. 
     * TODO: tabulate the length of the discarded TLD, and correct the captured values */
    if (ret) {
        std::sort(leaked_tld.begin(), leaked_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_tld.size() && i < 256; i++) {
            AddLine(leaked_tld[i], true);
        }

        for (size_t i = 256; i < leaked_tld.size() && i < 256; i++) {
            size_t len = strlen(leaked_tld[i]->key_value);

            if (len < 64)
            {
                skipped_tld_length[len]++;
            }
        }
    }

    if (ret) {
        /* Add the leaked length to the current counts */
        for (size_t i = 0; i < summary.size(); i++)
        {
            if (strcmp(summary[i]->registry_name, leak_by_length_id) == 0 &&
                summary[i]->key_number > 0 &&
                summary[i]->key_number < 64)
            {
                summary[i]->count += skipped_tld_length[summary[i]->key_number];
                skipped_tld_length[summary[i]->key_number] = 0;
            }
        }

        for (int i = 0; i < 64; i++)
        {
            if (skipped_tld_length[i] != 0)
            {
                CaptureLine length_pattern;

                length_pattern.count = skipped_tld_length[i];
                length_pattern.key_type = 0;
                length_pattern.key_number = i;

                memcpy(length_pattern.registry_name, leak_by_length_id, strlen(leak_by_length_id) + 1);

                AddLine(&length_pattern, true);
                skipped_tld_length[i] = 0;
            }
        }
    }

    if (ret) {
        /* Sort the whole thing again */
        Sort();
    }

    /* Clean up */

    for (size_t i = 0; i < frequent_tld.size(); i++)
    {
        if (frequent_tld[i] != NULL)
        {
            delete frequent_tld[i];
            frequent_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_tld.size(); i++)
    {
        if (leaked_tld[i] != NULL)
        {
            delete leaked_tld[i];
            leaked_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_2ld.size(); i++)
    {
        if (leaked_2ld[i] != NULL)
        {
            delete leaked_2ld[i];
            leaked_2ld[i] = NULL;
        }
    }

    if (local_leak != NULL)
    {
        delete local_leak;
        local_leak = NULL;
    }

    return ret;
}